

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_size_is_populated_from_the_subject_list_size_Test::TestBody
          (SubscriptionSyncTest_test_size_is_populated_from_the_subject_list_size_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  SubscriptionSync subscription_sync;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_88;
  code *local_70 [4];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  local_50;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_20;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_88,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
            ((SubscriptionSync *)local_70,0x7b,&local_88);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_88);
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(subject_list._8_8_ - subject_list._0_8_) >> 3) * -0x5555555555555555);
  local_a0.data_ = (AssertHelperData *)bidfx_public_api::price::pixie::SubscriptionSync::GetSize();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_98,"subject_list.size()","subscription_sync.GetSize()",(unsigned_long *)&local_a8
             ,(unsigned_long *)&local_a0);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70[0] = bidfx_public_api::price::pixie::WelcomeMessage::operator==;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_20);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_size_is_populated_from_the_subject_list_size)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    ASSERT_EQ(subject_list.size(), subscription_sync.GetSize());
}